

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O1

ThreadContextTLSEntry * ThreadContextTLSEntry::CreateEntryForCurrentThread(void)

{
  HeapAllocator *alloc;
  ThreadContextTLSEntry *pTVar1;
  long lVar2;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_31c30c4;
  data.filename._0_4_ = 0xbb;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
  pTVar1 = (ThreadContextTLSEntry *)new<Memory::HeapAllocator>(0x18,alloc,0x392910);
  StackProber::Initialize(&pTVar1->prober);
  lVar2 = __tls_get_addr(&PTR_0155f718);
  *(ThreadContextTLSEntry **)(lVar2 + 0x90) = pTVar1;
  return pTVar1;
}

Assistant:

ThreadContextTLSEntry * ThreadContextTLSEntry::CreateEntryForCurrentThread()
{
    ASSERT_ENTRY_INITIALIZED();
#ifdef _WIN32
    Assert(TlsGetValue(s_tlsSlot) == NULL);
#endif

    ThreadContextTLSEntry * entry = HeapNewStructZ(ThreadContextTLSEntry);
#pragma prefast(suppress:6001, "Memory from HeapNewStructZ are zero initialized")
    entry->prober.Initialize();
    TlsSetValue(s_tlsSlot, entry);

    return entry;
}